

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O1

FT_Error ft_var_load_item_variation_store(TT_Face face,FT_ULong offset,GX_ItemVarStore itemStore)

{
  FT_Stream stream;
  FT_Memory memory;
  GX_Blend pGVar1;
  bool bVar2;
  bool bVar3;
  FT_Char FVar4;
  FT_UShort FVar5;
  FT_UShort FVar6;
  FT_UShort FVar7;
  FT_ULong FVar8;
  FT_Pointer P;
  FT_ULong FVar9;
  GX_VarRegion pGVar10;
  GX_ItemVarStore pGVar11;
  undefined6 extraout_var;
  undefined6 extraout_var_00;
  undefined6 extraout_var_01;
  GX_ItemVarStore pGVar12;
  GX_ItemVarData pGVar13;
  FT_UInt *pFVar14;
  FT_Short *pFVar15;
  ulong uVar16;
  FT_UShort *pFVar17;
  uint uVar18;
  ulong local_60;
  uint local_44;
  FT_Error local_34 [2];
  FT_Error error;
  
  stream = (face->root).stream;
  memory = stream->memory;
  pGVar1 = face->blend;
  local_34[0] = FT_Stream_Seek(stream,offset);
  if (local_34[0] == 0) {
    FVar5 = FT_Stream_ReadUShort(stream,local_34);
    if (local_34[0] == 0) {
      if (FVar5 == 1) {
        FVar8 = FT_Stream_ReadULong(stream,local_34);
        if (local_34[0] == 0) {
          FVar5 = FT_Stream_ReadUShort(stream,local_34);
          itemStore->dataCount = (uint)FVar5;
          if (local_34[0] == 0) {
            if (FVar5 != 0) {
              P = ft_mem_realloc(memory,8,0,(ulong)FVar5,(void *)0x0,local_34);
              if (local_34[0] == 0) {
                if (itemStore->dataCount != 0) {
                  uVar16 = 0;
                  do {
                    FVar9 = FT_Stream_ReadULong(stream,local_34);
                    *(FT_ULong *)((long)P + uVar16 * 8) = FVar9;
                    if (local_34[0] != 0) goto LAB_0022bb49;
                    uVar16 = uVar16 + 1;
                  } while (uVar16 < itemStore->dataCount);
                }
                local_34[0] = FT_Stream_Seek(stream,FVar8 + offset);
                if (local_34[0] == 0) {
                  FVar5 = FT_Stream_ReadUShort(stream,local_34);
                  itemStore->axisCount = FVar5;
                  if (local_34[0] == 0) {
                    FVar5 = FT_Stream_ReadUShort(stream,local_34);
                    itemStore->regionCount = (uint)FVar5;
                    if (local_34[0] == 0) {
                      if (pGVar1->mmvar->num_axis == (uint)itemStore->axisCount) {
                        pGVar10 = (GX_VarRegion)
                                  ft_mem_realloc(memory,8,0,(ulong)FVar5,(void *)0x0,local_34);
                        itemStore->varRegionList = pGVar10;
                        if (local_34[0] == 0) {
                          if (itemStore->regionCount != 0) {
                            uVar16 = 0;
                            do {
                              pGVar11 = (GX_ItemVarStore)
                                        ft_mem_realloc(memory,0x18,0,(ulong)itemStore->axisCount,
                                                       (void *)0x0,local_34);
                              itemStore->varRegionList[uVar16].axisList = (GX_AxisCoords)pGVar11;
                              bVar2 = true;
                              pGVar12 = pGVar11;
                              if (local_34[0] == 0) {
                                pGVar12 = itemStore;
                                if (itemStore->axisCount != 0) {
                                  pFVar17 = &pGVar11->axisCount;
                                  pGVar11 = (GX_ItemVarStore)0x0;
                                  do {
                                    FVar5 = FT_Stream_ReadUShort(stream,local_34);
                                    pGVar12 = (GX_ItemVarStore)CONCAT62(extraout_var,FVar5);
                                    bVar2 = true;
                                    if (local_34[0] == 0) {
                                      FVar7 = FT_Stream_ReadUShort(stream,local_34);
                                      pGVar12 = (GX_ItemVarStore)CONCAT62(extraout_var_00,FVar7);
                                      if (local_34[0] == 0) {
                                        FVar6 = FT_Stream_ReadUShort(stream,local_34);
                                        pGVar12 = (GX_ItemVarStore)CONCAT62(extraout_var_01,FVar6);
                                        bVar3 = false;
                                        bVar2 = true;
                                        if (local_34[0] == 0) {
                                          *(long *)&((GX_ItemVarStoreRec_ *)(pFVar17 + -8))->
                                                    dataCount = (long)(short)FVar5 << 2;
                                          *(GX_ItemVarData *)(pFVar17 + -4) =
                                               (GX_ItemVarData)((long)(short)FVar7 << 2);
                                          pGVar12 = (GX_ItemVarStore)((long)(short)FVar6 << 2);
                                          *(GX_ItemVarStore *)pFVar17 = pGVar12;
                                          bVar3 = true;
                                          bVar2 = false;
                                        }
                                      }
                                      else {
                                        bVar3 = false;
                                        bVar2 = true;
                                      }
                                    }
                                    else {
                                      bVar3 = false;
                                    }
                                    if (!bVar3) goto LAB_0022bcde;
                                    pGVar11 = (GX_ItemVarStore)((long)&pGVar11->dataCount + 1);
                                    pGVar12 = (GX_ItemVarStore)(ulong)itemStore->axisCount;
                                    pFVar17 = pFVar17 + 0xc;
                                  } while (pGVar11 < pGVar12);
                                }
                                bVar2 = false;
                              }
LAB_0022bcde:
                              if (bVar2) {
                                if (!bVar2) {
                                  return (FT_Error)pGVar12;
                                }
                                goto LAB_0022bb49;
                              }
                              uVar16 = uVar16 + 1;
                            } while (uVar16 < itemStore->regionCount);
                          }
                          pGVar13 = (GX_ItemVarData)
                                    ft_mem_realloc(memory,0x18,0,(ulong)itemStore->dataCount,
                                                   (void *)0x0,local_34);
                          itemStore->varData = pGVar13;
                          if ((local_34[0] == 0) && (itemStore->dataCount != 0)) {
                            local_60 = 0;
                            while( true ) {
                              pGVar13 = itemStore->varData + local_60;
                              local_34[0] = FT_Stream_Seek(stream,*(long *)((long)P + local_60 * 8)
                                                                  + offset);
                              if (local_34[0] != 0) break;
                              FVar5 = FT_Stream_ReadUShort(stream,local_34);
                              pGVar13->itemCount = (uint)FVar5;
                              if ((local_34[0] != 0) ||
                                 (FVar5 = FT_Stream_ReadUShort(stream,local_34), local_34[0] != 0))
                              break;
                              FVar7 = FT_Stream_ReadUShort(stream,local_34);
                              pGVar13->regionIdxCount = (uint)FVar7;
                              if (local_34[0] != 0) break;
                              if ((FVar7 < FVar5) || (itemStore->regionCount < (uint)FVar7)) {
LAB_0022bf70:
                                local_34[0] = 8;
                                break;
                              }
                              pFVar14 = (FT_UInt *)
                                        ft_mem_realloc(memory,4,0,(ulong)FVar7,(void *)0x0,local_34)
                              ;
                              pGVar13->regionIndices = pFVar14;
                              if (local_34[0] != 0) break;
                              uVar18 = pGVar13->regionIdxCount;
                              if (uVar18 != 0) {
                                uVar16 = 0;
                                do {
                                  FVar7 = FT_Stream_ReadUShort(stream,local_34);
                                  pGVar13->regionIndices[uVar16] = (uint)FVar7;
                                  if (local_34[0] != 0) goto LAB_0022bb49;
                                  if (itemStore->regionCount < (uint)FVar7 ||
                                      itemStore->regionCount == (uint)FVar7) goto LAB_0022bf70;
                                  uVar16 = uVar16 + 1;
                                  uVar18 = pGVar13->regionIdxCount;
                                } while (uVar16 < uVar18);
                              }
                              pFVar15 = (FT_Short *)
                                        ft_mem_realloc(memory,2,0,
                                                       (ulong)(uVar18 * pGVar13->itemCount),
                                                       (void *)0x0,local_34);
                              pGVar13->deltaSet = pFVar15;
                              if (local_34[0] != 0) break;
                              if (pGVar13->regionIdxCount * pGVar13->itemCount != 0) {
                                uVar16 = 0;
                                do {
                                  local_44 = 0;
                                  uVar18 = (uint)FVar5;
                                  if (FVar5 != 0) {
                                    do {
                                      FVar7 = FT_Stream_ReadUShort(stream,local_34);
                                      if (local_34[0] != 0) goto LAB_0022bb49;
                                      pGVar13->deltaSet[uVar16] = FVar7;
                                      uVar16 = (ulong)((int)uVar16 + 1);
                                      uVar18 = uVar18 - 1;
                                      local_44 = (uint)FVar5;
                                    } while (uVar18 != 0);
                                  }
                                  if (local_44 < pGVar13->regionIdxCount) {
                                    do {
                                      FVar4 = FT_Stream_ReadChar(stream,local_34);
                                      if (local_34[0] != 0) goto LAB_0022bb49;
                                      pGVar13->deltaSet[uVar16] = (short)FVar4;
                                      local_44 = local_44 + 1;
                                      uVar16 = (ulong)((int)uVar16 + 1);
                                    } while (local_44 < pGVar13->regionIdxCount);
                                  }
                                } while ((uint)uVar16 < pGVar13->regionIdxCount * pGVar13->itemCount
                                        );
                              }
                              local_60 = local_60 + 1;
                              if (itemStore->dataCount <= local_60) break;
                            }
                          }
                        }
                      }
                      else {
                        local_34[0] = 8;
                      }
                    }
                  }
                }
              }
              goto LAB_0022bb49;
            }
            goto LAB_0022bb3f;
          }
        }
      }
      else {
LAB_0022bb3f:
        local_34[0] = 8;
      }
    }
  }
  P = (void *)0x0;
LAB_0022bb49:
  ft_mem_free(memory,P);
  return local_34[0];
}

Assistant:

static FT_Error
  ft_var_load_item_variation_store( TT_Face          face,
                                    FT_ULong         offset,
                                    GX_ItemVarStore  itemStore )
  {
    FT_Stream  stream = FT_FACE_STREAM( face );
    FT_Memory  memory = stream->memory;

    FT_Error   error;
    FT_UShort  format;
    FT_ULong   region_offset;
    FT_UInt    i, j, k;
    FT_UInt    shortDeltaCount;

    GX_Blend        blend = face->blend;
    GX_ItemVarData  varData;

    FT_ULong*  dataOffsetArray = NULL;


    if ( FT_STREAM_SEEK( offset ) ||
         FT_READ_USHORT( format ) )
      goto Exit;

    if ( format != 1 )
    {
      FT_TRACE2(( "ft_var_load_item_variation_store: bad store format %d\n",
                  format ));
      error = FT_THROW( Invalid_Table );
      goto Exit;
    }

    /* read top level fields */
    if ( FT_READ_ULONG( region_offset )         ||
         FT_READ_USHORT( itemStore->dataCount ) )
      goto Exit;

    /* we need at least one entry in `itemStore->varData' */
    if ( !itemStore->dataCount )
    {
      FT_TRACE2(( "ft_var_load_item_variation_store: missing varData\n" ));
      error = FT_THROW( Invalid_Table );
      goto Exit;
    }

    /* make temporary copy of item variation data offsets; */
    /* we will parse region list first, then come back     */
    if ( FT_NEW_ARRAY( dataOffsetArray, itemStore->dataCount ) )
      goto Exit;

    for ( i = 0; i < itemStore->dataCount; i++ )
    {
      if ( FT_READ_ULONG( dataOffsetArray[i] ) )
        goto Exit;
    }

    /* parse array of region records (region list) */
    if ( FT_STREAM_SEEK( offset + region_offset ) )
      goto Exit;

    if ( FT_READ_USHORT( itemStore->axisCount )   ||
         FT_READ_USHORT( itemStore->regionCount ) )
      goto Exit;

    if ( itemStore->axisCount != (FT_Long)blend->mmvar->num_axis )
    {
      FT_TRACE2(( "ft_var_load_item_variation_store:"
                  " number of axes in item variation store\n"
                  "                                 "
                  " and `fvar' table are different\n" ));
      error = FT_THROW( Invalid_Table );
      goto Exit;
    }

    if ( FT_NEW_ARRAY( itemStore->varRegionList, itemStore->regionCount ) )
      goto Exit;

    for ( i = 0; i < itemStore->regionCount; i++ )
    {
      GX_AxisCoords  axisCoords;


      if ( FT_NEW_ARRAY( itemStore->varRegionList[i].axisList,
                         itemStore->axisCount ) )
        goto Exit;

      axisCoords = itemStore->varRegionList[i].axisList;

      for ( j = 0; j < itemStore->axisCount; j++ )
      {
        FT_Short  start, peak, end;


        if ( FT_READ_SHORT( start ) ||
             FT_READ_SHORT( peak )  ||
             FT_READ_SHORT( end )   )
          goto Exit;

        axisCoords[j].startCoord = FT_fdot14ToFixed( start );
        axisCoords[j].peakCoord  = FT_fdot14ToFixed( peak );
        axisCoords[j].endCoord   = FT_fdot14ToFixed( end );
      }
    }

    /* end of region list parse */

    /* use dataOffsetArray now to parse varData items */
    if ( FT_NEW_ARRAY( itemStore->varData, itemStore->dataCount ) )
      goto Exit;

    for ( i = 0; i < itemStore->dataCount; i++ )
    {
      varData = &itemStore->varData[i];

      if ( FT_STREAM_SEEK( offset + dataOffsetArray[i] ) )
        goto Exit;

      if ( FT_READ_USHORT( varData->itemCount )      ||
           FT_READ_USHORT( shortDeltaCount )         ||
           FT_READ_USHORT( varData->regionIdxCount ) )
        goto Exit;

      /* check some data consistency */
      if ( shortDeltaCount > varData->regionIdxCount )
      {
        FT_TRACE2(( "bad short count %d or region count %d\n",
                    shortDeltaCount,
                    varData->regionIdxCount ));
        error = FT_THROW( Invalid_Table );
        goto Exit;
      }

      if ( varData->regionIdxCount > itemStore->regionCount )
      {
        FT_TRACE2(( "inconsistent regionCount %d in varData[%d]\n",
                    varData->regionIdxCount,
                    i ));
        error = FT_THROW( Invalid_Table );
        goto Exit;
      }

      /* parse region indices */
      if ( FT_NEW_ARRAY( varData->regionIndices,
                         varData->regionIdxCount ) )
        goto Exit;

      for ( j = 0; j < varData->regionIdxCount; j++ )
      {
        if ( FT_READ_USHORT( varData->regionIndices[j] ) )
          goto Exit;

        if ( varData->regionIndices[j] >= itemStore->regionCount )
        {
          FT_TRACE2(( "bad region index %d\n",
                      varData->regionIndices[j] ));
          error = FT_THROW( Invalid_Table );
          goto Exit;
        }
      }

      /* Parse delta set.                                                */
      /*                                                                 */
      /* On input, deltas are (shortDeltaCount + regionIdxCount) bytes   */
      /* each; on output, deltas are expanded to `regionIdxCount' shorts */
      /* each.                                                           */
      if ( FT_NEW_ARRAY( varData->deltaSet,
                         varData->regionIdxCount * varData->itemCount ) )
        goto Exit;

      /* the delta set is stored as a 2-dimensional array of shorts; */
      /* sign-extend signed bytes to signed shorts                   */
      for ( j = 0; j < varData->itemCount * varData->regionIdxCount; )
      {
        for ( k = 0; k < shortDeltaCount; k++, j++ )
        {
          /* read the short deltas */
          FT_Short  delta;


          if ( FT_READ_SHORT( delta ) )
            goto Exit;

          varData->deltaSet[j] = delta;
        }

        for ( ; k < varData->regionIdxCount; k++, j++ )
        {
          /* read the (signed) byte deltas */
          FT_Char  delta;


          if ( FT_READ_CHAR( delta ) )
            goto Exit;

          varData->deltaSet[j] = delta;
        }
      }
    }

  Exit:
    FT_FREE( dataOffsetArray );

    return error;
  }